

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

int Io_MvParseLineNamesBlif(Io_MvMod_t *p,char *pLine)

{
  Vec_Ptr_t *vTokens_00;
  Io_MvMan_t *pIVar1;
  Abc_Ntk_t *pNtk;
  void **ppvVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  size_t sVar7;
  char *pName;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pNet;
  Vec_Ptr_t *vTokens;
  char *pLine_local;
  Io_MvMod_t *p_local;
  
  vTokens_00 = p->pMan->vTokens;
  if (p->pMan->fBlifMv != 0) {
    __assert_fail("!p->pMan->fBlifMv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlifMv.c"
                  ,0x81e,"int Io_MvParseLineNamesBlif(Io_MvMod_t *, char *)");
  }
  Io_MvSplitIntoTokens(vTokens_00,pLine,'\0');
  pcVar5 = (char *)Vec_PtrEntry(vTokens_00,0);
  iVar3 = strcmp(pcVar5,"gate");
  if (iVar3 == 0) {
    p_local._4_4_ = Io_MvParseLineGateBlif(p,vTokens_00);
  }
  else {
    pcVar5 = (char *)Vec_PtrEntry(vTokens_00,0);
    iVar3 = strcmp(pcVar5,"names");
    if (iVar3 != 0) {
      __assert_fail("!strcmp((char *)Vec_PtrEntry(vTokens,0), \"names\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlifMv.c"
                    ,0x824,"int Io_MvParseLineNamesBlif(Io_MvMod_t *, char *)");
    }
    pcVar5 = (char *)Vec_PtrEntryLast(vTokens_00);
    pAVar6 = Abc_NtkFindOrCreateNet(p->pNtk,pcVar5);
    iVar3 = Abc_ObjFaninNum(pAVar6);
    if (iVar3 < 1) {
      pNtk = p->pNtk;
      ppvVar2 = vTokens_00->pArray;
      iVar3 = Vec_PtrSize(vTokens_00);
      pAVar6 = Io_ReadCreateNode(pNtk,pcVar5,(char **)(ppvVar2 + 1),iVar3 + -2);
      sVar7 = strlen(pcVar5);
      iVar3 = Abc_ObjFaninNum(pAVar6);
      pcVar5 = Io_MvParseTableBlif(p,pcVar5 + sVar7,iVar3);
      (pAVar6->field_5).pData = pcVar5;
      if ((pAVar6->field_5).pData == (void *)0x0) {
        p_local._4_4_ = 0;
      }
      else {
        pcVar5 = Abc_SopRegister((Mem_Flex_t *)p->pNtk->pManFunc,(char *)(pAVar6->field_5).pData);
        (pAVar6->field_5).pData = pcVar5;
        p_local._4_4_ = 1;
      }
    }
    else {
      pIVar1 = p->pMan;
      uVar4 = Io_MvGetLine(p->pMan,pcVar5);
      sprintf(pIVar1->sError,"Line %d: Signal \"%s\" is defined more than once.",(ulong)uVar4,pcVar5
             );
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int Io_MvParseLineNamesBlif( Io_MvMod_t * p, char * pLine )
{
    Vec_Ptr_t * vTokens = p->pMan->vTokens;
    Abc_Obj_t * pNet, * pNode;
    char * pName;
    assert( !p->pMan->fBlifMv );
    Io_MvSplitIntoTokens( vTokens, pLine, '\0' );
    // parse the mapped node
    if ( !strcmp((char *)Vec_PtrEntry(vTokens,0), "gate") )
        return Io_MvParseLineGateBlif( p, vTokens );
    // parse the regular name line
    assert( !strcmp((char *)Vec_PtrEntry(vTokens,0), "names") );
    pName = (char *)Vec_PtrEntryLast( vTokens );
    pNet = Abc_NtkFindOrCreateNet( p->pNtk, pName );
    if ( Abc_ObjFaninNum(pNet) > 0 )
    {
        sprintf( p->pMan->sError, "Line %d: Signal \"%s\" is defined more than once.", Io_MvGetLine(p->pMan, pName), pName );
        return 0;
    }
    // create fanins
    pNode = Io_ReadCreateNode( p->pNtk, pName, (char **)(vTokens->pArray + 1), Vec_PtrSize(vTokens) - 2 );
    // parse the table of this node
    pNode->pData = Io_MvParseTableBlif( p, pName + strlen(pName), Abc_ObjFaninNum(pNode) );
    if ( pNode->pData == NULL )
        return 0;
    pNode->pData = Abc_SopRegister( (Mem_Flex_t *)p->pNtk->pManFunc, (char *)pNode->pData );
    return 1;
}